

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AccumulatorView.hpp
# Opt level: O1

void __thiscall
OpenMD::Utils::AccumulatorView<OpenMD::Utils::Accumulator<double>_>::writeData
          (AccumulatorView<OpenMD::Utils::Accumulator<double>_> *this,ostream *stream,
          string *errorMessage,DataHandling dataHandling)

{
  size_t sVar1;
  double dVar2;
  
  switch(dataHandling) {
  case Average:
    dVar2 = (this->super_RealAccumulator).Avg_;
    break;
  case Last:
    dVar2 = (this->super_RealAccumulator).Val_;
    break;
  case Max:
    dVar2 = (this->super_RealAccumulator).Max_;
    break;
  case Min:
    dVar2 = (this->super_RealAccumulator).Min_;
    break;
  case Total:
    dVar2 = (this->super_RealAccumulator).Total_;
    break;
  default:
    dVar2 = 0.0;
  }
  if ((ulong)ABS(dVar2) < 0x7ff0000000000000) {
    sVar1 = (this->super_RealAccumulator).Count_;
    std::__ostream_insert<char,std::char_traits<char>>(stream,"\t",1);
    if (sVar1 == 0) {
      return;
    }
    std::ostream::_M_insert<double>(dVar2);
    return;
  }
  snprintf(painCave.errMsg,2000,"%s",(errorMessage->_M_dataplus)._M_p);
  painCave.isFatal = 1;
  simError();
  return;
}

Assistant:

void writeData(std::ostream& stream, const std::string& errorMessage,
                   DataHandling dataHandling) const override {
      RealType dat {};
      std::size_t count = RealAccumulator::getCount();

      switch (dataHandling) {
      case DataHandling::Average:
        dat = RealAccumulator::getAverage();
        break;
      case DataHandling::Last:
        dat = RealAccumulator::getLastValue();
        break;
      case DataHandling::Max:
        dat = RealAccumulator::getMax();
        break;
      case DataHandling::Min:
        dat = RealAccumulator::getMin();
        break;
      case DataHandling::Total:
        dat = RealAccumulator::getTotal();
        break;
      default:
        break;
      }

      if (std::isinf(dat) || std::isnan(dat)) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH, "%s",
                 errorMessage.c_str());
        painCave.isFatal = 1;
        simError();
      } else {
        if (count == 0)
          stream << "\t";
        else
          stream << "\t" << dat;
      }
    }